

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
::TPZFrontMatrix(TPZFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
                 *this)

{
  TPZRegisterClassId *in_RDI;
  TPZRegisterClassId *this_00;
  TPZVec<int> *this_01;
  void **in_stack_ffffffffffffffb8;
  TPZAbstractFrontMatrix<std::complex<float>_> *in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffd8;
  TPZVec<int> *in_stack_ffffffffffffffe0;
  
  TPZRegisterClassId::
  TPZRegisterClassId<TPZFrontMatrix<std::complex<float>,TPZStackEqnStorage<std::complex<float>>,TPZFrontSym<std::complex<float>>>>
            (in_RDI,0x21);
  TPZAbstractFrontMatrix<std::complex<float>_>::TPZAbstractFrontMatrix
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined ***)in_RDI = &PTR__TPZFrontMatrix_02544260;
  TPZStackEqnStorage<std::complex<float>_>::TPZStackEqnStorage
            ((TPZStackEqnStorage<std::complex<float>_> *)(in_RDI + 0x20));
  this_00 = in_RDI + 0x1f9e8;
  TPZFrontSym<std::complex<float>_>::TPZFrontSym((TPZFrontSym<std::complex<float>_> *)this_00);
  this_01 = (TPZVec<int> *)(in_RDI + 0x1fb20);
  TPZVec<int>::TPZVec(this_01);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x1fb40));
  TPZFrontSym<std::complex<float>_>::Reset
            ((TPZFrontSym<std::complex<float>_> *)this_00,(int64_t)this_01);
  TPZStackEqnStorage<std::complex<float>_>::Reset
            ((TPZStackEqnStorage<std::complex<float>_> *)0x1cece59);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(undefined8 *)(in_RDI + 0x1fb18) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0x1fb10) = 0;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::TPZFrontMatrix() : TPZRegisterClassId(&TPZFrontMatrix::ClassId),
TPZAbstractFrontMatrix<TVar>()
{
	fFront.Reset();
	fStorage.Reset();
	fNumElConnected.Resize(0);
	fNumElConnectedBackup.Resize(0);
	fLastDecomposed = -1;
	fNumEq=0;
}